

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Parsing.c
# Opt level: O0

WJTL_STATUS
VerifyJsonParsesAsListOfStrings(_Bool IsJson5,char *Json,char **StringArray,size_t StringArrayCount)

{
  JL_STATUS JVar1;
  JL_DATA_TYPE JVar2;
  uint32_t uVar3;
  int iVar4;
  bool Condition;
  _Bool _result_10;
  _Bool _result_9;
  _Bool _result_8;
  _Bool _result_7;
  _Bool _result_6;
  char *pcStack_68;
  _Bool _result_5;
  char *string;
  size_t i;
  _Bool _result_4;
  _Bool _result_3;
  _Bool _result_2;
  _Bool _result_1;
  JlDataObject *pJStack_50;
  _Bool _result;
  JlDataObject *object;
  JlListItem *enumerator;
  size_t sStack_38;
  WJTL_STATUS TestReturn;
  size_t errorAtPos;
  JlDataObject *listObject;
  size_t StringArrayCount_local;
  char **StringArray_local;
  char *Json_local;
  _Bool IsJson5_local;
  
  errorAtPos = 0;
  sStack_38 = 100;
  enumerator._4_4_ = WJTL_STATUS_SUCCESS;
  object = (JlDataObject *)0x0;
  pJStack_50 = (JlDataObject *)0x0;
  listObject = (JlDataObject *)StringArrayCount;
  StringArrayCount_local = (size_t)StringArray;
  StringArray_local = (char **)Json;
  Json_local._7_1_ = IsJson5;
  JVar1 = JlParseJsonEx(Json,IsJson5,(JlDataObject **)&errorAtPos,&stack0xffffffffffffffc8);
  i._7_1_ = JVar1 == JL_STATUS_SUCCESS;
  WjTestLib_Assert((_Bool)i._7_1_,
                   "((JL_STATUS)(JlParseJsonEx( Json, IsJson5, &listObject, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfStrings",0x23f);
  if ((i._7_1_ & 1) == 0) {
    enumerator._4_4_ = WJTL_STATUS_FAILED;
  }
  i._6_1_ = errorAtPos != 0;
  WjTestLib_Assert((_Bool)i._6_1_,"(listObject) != NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfStrings",0x240);
  if ((i._6_1_ & 1) == 0) {
    enumerator._4_4_ = WJTL_STATUS_FAILED;
  }
  JVar2 = JlGetObjectType((JlDataObject *)errorAtPos);
  i._5_1_ = JVar2 == JL_DATA_TYPE_LIST;
  WjTestLib_Assert((_Bool)i._5_1_,"JlGetObjectType( listObject ) == JL_DATA_TYPE_LIST",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfStrings",0x241);
  if ((i._5_1_ & 1) == 0) {
    enumerator._4_4_ = WJTL_STATUS_FAILED;
  }
  i._4_1_ = sStack_38 == 0;
  WjTestLib_Assert((_Bool)i._4_1_,"errorAtPos == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfStrings",0x242);
  if ((i._4_1_ & 1) == 0) {
    enumerator._4_4_ = WJTL_STATUS_FAILED;
  }
  uVar3 = JlGetListCount((JlDataObject *)errorAtPos);
  i._3_1_ = (JlDataObject *)(ulong)uVar3 == listObject;
  WjTestLib_Assert((_Bool)i._3_1_,"JlGetListCount( listObject ) == StringArrayCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfStrings",0x244);
  if ((i._3_1_ & 1) == 0) {
    enumerator._4_4_ = WJTL_STATUS_FAILED;
  }
  object = (JlDataObject *)0x0;
  for (string = (char *)0x0; string < listObject; string = string + 1) {
    pcStack_68 = (char *)0x0;
    pJStack_50 = (JlDataObject *)0x0;
    JVar1 = JlGetObjectListNextItem
                      ((JlDataObject *)errorAtPos,&stack0xffffffffffffffb0,(JlListItem **)&object);
    WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                     "((JL_STATUS)(JlGetObjectListNextItem( listObject, &object, &enumerator ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsListOfStrings",0x24c);
    if (JVar1 != JL_STATUS_SUCCESS) {
      enumerator._4_4_ = WJTL_STATUS_FAILED;
    }
    Condition = pJStack_50 != (JlDataObject *)0x0;
    WjTestLib_Assert(Condition,"(object) != NULL",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsListOfStrings",0x24d);
    if (!Condition) {
      enumerator._4_4_ = WJTL_STATUS_FAILED;
    }
    JVar1 = JlGetObjectString(pJStack_50,&stack0xffffffffffffff98);
    WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                     "((JL_STATUS)(JlGetObjectString( object, &string ))) == (JL_STATUS_SUCCESS)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsListOfStrings",0x24e);
    if (JVar1 != JL_STATUS_SUCCESS) {
      enumerator._4_4_ = WJTL_STATUS_FAILED;
    }
    iVar4 = strcmp(pcStack_68,*(char **)(StringArrayCount_local + (long)string * 8));
    WjTestLib_Assert(iVar4 == 0,"strcmp( string, StringArray[i] ) == 0",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsListOfStrings",0x24f);
    if (iVar4 != 0) {
      enumerator._4_4_ = WJTL_STATUS_FAILED;
    }
  }
  JVar1 = JlGetObjectListNextItem
                    ((JlDataObject *)errorAtPos,&stack0xffffffffffffffb0,(JlListItem **)&object);
  WjTestLib_Assert(JVar1 == JL_STATUS_END_OF_DATA,
                   "(JlGetObjectListNextItem( listObject, &object, &enumerator )) == (JL_STATUS_END_OF_DATA)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfStrings",0x253);
  if (JVar1 != JL_STATUS_END_OF_DATA) {
    enumerator._4_4_ = WJTL_STATUS_FAILED;
  }
  JVar1 = JlFreeObjectTree((JlDataObject **)&errorAtPos);
  WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlFreeObjectTree( &listObject ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfStrings",0x256);
  if (JVar1 != JL_STATUS_SUCCESS) {
    enumerator._4_4_ = WJTL_STATUS_FAILED;
  }
  return enumerator._4_4_;
}

Assistant:

static
WJTL_STATUS
    VerifyJsonParsesAsListOfStrings
    (
        bool            IsJson5,
        char const*     Json,
        char const**    StringArray,
        size_t          StringArrayCount
    )
{
    JlDataObject*   listObject = NULL;
    size_t          errorAtPos = 100;
    WJTL_STATUS     TestReturn = WJTL_STATUS_SUCCESS;
    JlListItem*     enumerator = NULL;
    JlDataObject*   object = NULL;

    JL_ASSERT_SUCCESS( JlParseJsonEx( Json, IsJson5, &listObject, &errorAtPos ) );
    JL_ASSERT_NOT_NULL( listObject );
    JL_ASSERT( JlGetObjectType( listObject ) == JL_DATA_TYPE_LIST );
    JL_ASSERT( errorAtPos == 0 );

    JL_ASSERT( JlGetListCount( listObject ) == StringArrayCount );

    // Verify all elements in list match array
    enumerator = NULL;
    for( size_t i=0; i<StringArrayCount; i++ )
    {
        char const* string = NULL;
        object = NULL;
        JL_ASSERT_SUCCESS( JlGetObjectListNextItem( listObject, &object, &enumerator ) );
        JL_ASSERT_NOT_NULL( object );
        JL_ASSERT_SUCCESS( JlGetObjectString( object, &string ) );
        JL_ASSERT( strcmp( string, StringArray[i] ) == 0 );
    }

    // Verify there are no more items in the list
    JL_ASSERT_STATUS( JlGetObjectListNextItem( listObject, &object, &enumerator ), JL_STATUS_END_OF_DATA );

    // Clean up
    JL_ASSERT_SUCCESS( JlFreeObjectTree( &listObject ) );

    return TestReturn;
}